

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O2

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStackY_40;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_b = 0;
  if (handle == &client || handle == &server) {
    eval_a = (int64_t)flags;
    eval_b = 0;
    if (eval_a == 0) {
      if (nread < 0) {
        pcVar2 = "0 && \"unexpected error\"";
        uVar6 = 0x47;
LAB_001a9a92:
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
                ,uVar6,pcVar2);
        abort();
      }
      if (nread == 0) {
        if (addr == (sockaddr *)0x0) {
          return;
        }
        pcVar3 = "==";
        pcVar5 = "==";
        uStackY_40 = 0x4c;
      }
      else {
        if (addr != (sockaddr *)0x0) {
          eval_a = 4;
          if (nread == 4) {
            iVar1 = bcmp("PONG",buf->base,4);
            if (iVar1 == 0) {
              cl_recv_cb_called = cl_recv_cb_called + 1;
              uv_close((uv_handle_t *)handle,close_cb);
              return;
            }
            pcVar2 = "!memcmp(\"PONG\", buf->base, nread)";
            uVar6 = 0x52;
            goto LAB_001a9a92;
          }
          pcVar3 = "==";
          pcVar4 = "nread";
          pcVar2 = "4";
          uStackY_40 = 0x51;
          eval_b = nread;
          goto LAB_001a9a61;
        }
        pcVar3 = "!=";
        pcVar5 = "!=";
        addr = (sockaddr *)0x0;
        uStackY_40 = 0x50;
      }
      eval_b = 0;
      pcVar4 = "NULL";
      pcVar2 = "addr";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      eval_a = (int64_t)addr;
      goto LAB_001a9ae9;
    }
    pcVar3 = "==";
    pcVar4 = "0";
    pcVar2 = "flags";
    uStackY_40 = 0x44;
  }
  else {
    pcVar3 = "!=";
    pcVar4 = "0";
    pcVar2 = "(uv_udp_t*)(handle) == &server || (uv_udp_t*)(handle) == &client";
    uStackY_40 = 0x43;
    eval_a = 0;
  }
LAB_001a9a61:
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar5 = pcVar3;
LAB_001a9ae9:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
          ,uStackY_40,pcVar2,pcVar3,pcVar4,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT_OK(flags);

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards cl_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  ASSERT_NOT_NULL(addr);
  ASSERT_EQ(4, nread);
  ASSERT(!memcmp("PONG", buf->base, nread));

  cl_recv_cb_called++;

  uv_close((uv_handle_t*) handle, close_cb);
}